

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O0

void opn2_reset(OPN2_MIDIPlayer *device)

{
  OPNMIDIplay *this;
  MidiPlayer *play;
  OPN2_MIDIPlayer *device_local;
  
  if (device != (OPN2_MIDIPlayer *)0x0) {
    this = (OPNMIDIplay *)device->opn2_midiPlayer;
    if (this == (OPNMIDIplay *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/opnmidi.cpp"
                    ,0x2c1,"void opn2_reset(OPN2_MIDIPlayer *)");
    }
    OPNMIDIplay::partialReset(this);
    OPNMIDIplay::resetMIDI(this);
  }
  return;
}

Assistant:

OPNMIDI_EXPORT void opn2_reset(OPN2_MIDIPlayer *device)
{
    if(!device)
        return;
    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    play->partialReset();
    play->resetMIDI();
}